

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_tri_collision.cpp
# Opt level: O3

bool __thiscall
GIM_TRIANGLE_CALCULATION_CACHE::triangle_collision
          (GIM_TRIANGLE_CALCULATION_CACHE *this,btVector3 *u0,btVector3 *u1,btVector3 *u2,
          btScalar margin_u,btVector3 *v0,btVector3 *v1,btVector3 *v2,btScalar margin_v,
          GIM_TRIANGLE_CONTACT_DATA *contacts)

{
  btVector3 *clip_points;
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  btScalar *pbVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined8 uVar34;
  float fVar35;
  float fVar36;
  float local_d8;
  uint local_68 [18];
  
  fVar12 = margin_u + margin_v;
  this->margin = fVar12;
  uVar34 = *(undefined8 *)(u0->m_floats + 2);
  *(undefined8 *)this->tu_vertices[0].m_floats = *(undefined8 *)u0->m_floats;
  *(undefined8 *)(this->tu_vertices[0].m_floats + 2) = uVar34;
  uVar34 = *(undefined8 *)(u1->m_floats + 2);
  *(undefined8 *)this->tu_vertices[1].m_floats = *(undefined8 *)u1->m_floats;
  *(undefined8 *)(this->tu_vertices[1].m_floats + 2) = uVar34;
  uVar34 = *(undefined8 *)(u2->m_floats + 2);
  *(undefined8 *)this->tu_vertices[2].m_floats = *(undefined8 *)u2->m_floats;
  *(undefined8 *)(this->tu_vertices[2].m_floats + 2) = uVar34;
  uVar34 = *(undefined8 *)(v0->m_floats + 2);
  *(undefined8 *)this->tv_vertices[0].m_floats = *(undefined8 *)v0->m_floats;
  *(undefined8 *)(this->tv_vertices[0].m_floats + 2) = uVar34;
  uVar34 = *(undefined8 *)(v1->m_floats + 2);
  *(undefined8 *)this->tv_vertices[1].m_floats = *(undefined8 *)v1->m_floats;
  *(undefined8 *)(this->tv_vertices[1].m_floats + 2) = uVar34;
  uVar34 = *(undefined8 *)(v2->m_floats + 2);
  *(undefined8 *)this->tv_vertices[2].m_floats = *(undefined8 *)v2->m_floats;
  *(undefined8 *)(this->tv_vertices[2].m_floats + 2) = uVar34;
  uVar34 = *(undefined8 *)this->tv_vertices[1].m_floats;
  uVar23 = *(undefined8 *)this->tv_vertices[0].m_floats;
  fVar32 = (float)uVar23;
  local_d8 = (float)((ulong)uVar23 >> 0x20);
  fVar8 = (float)uVar34;
  fVar13 = (float)((ulong)uVar34 >> 0x20);
  fVar18 = this->tv_vertices[1].m_floats[2];
  fVar16 = this->tv_vertices[0].m_floats[2];
  fVar14 = this->tv_vertices[2].m_floats[0];
  fVar15 = this->tv_vertices[2].m_floats[1];
  fVar22 = fVar15 - local_d8;
  fVar1 = this->tv_vertices[2].m_floats[2];
  fVar17 = fVar14 - fVar32;
  fVar20 = fVar1 - fVar16;
  fVar21 = fVar20 * (fVar13 - local_d8) - fVar22 * (fVar18 - fVar16);
  fVar20 = (fVar18 - fVar16) * fVar17 - fVar20 * (fVar8 - fVar32);
  *(ulong *)(this->tv_plane).super_btVector3.m_floats = CONCAT44(fVar20,fVar21);
  fVar22 = fVar22 * (fVar8 - fVar32) - (fVar13 - local_d8) * fVar17;
  (this->tv_plane).super_btVector3.m_floats[2] = fVar22;
  fVar17 = fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20;
  if (1e-07 < fVar17) {
    fVar7 = (float)(0x5f3759df - ((uint)fVar17 >> 1));
    fVar7 = (fVar17 * -0.5 * fVar7 * fVar7 + 1.5) * fVar7;
    if (fVar7 < 3.4028235e+38) {
      fVar22 = fVar22 * fVar7;
      fVar21 = fVar21 * fVar7;
      fVar20 = fVar20 * fVar7;
      *(ulong *)(this->tv_plane).super_btVector3.m_floats = CONCAT44(fVar20,fVar21);
      (this->tv_plane).super_btVector3.m_floats[2] = fVar22;
    }
  }
  fVar17 = this->tu_vertices[0].m_floats[2];
  uVar2 = *(undefined8 *)this->tu_vertices[0].m_floats;
  uVar3 = *(undefined8 *)this->tu_vertices[1].m_floats;
  fVar30 = (float)uVar3;
  fVar33 = (float)((ulong)uVar3 >> 0x20);
  fVar7 = this->tu_vertices[1].m_floats[2];
  fVar28 = (float)uVar2;
  fVar29 = (float)((ulong)uVar2 >> 0x20);
  fVar19 = this->tu_vertices[2].m_floats[0];
  fVar31 = this->tu_vertices[2].m_floats[1];
  fVar27 = this->tu_vertices[2].m_floats[2];
  fVar36 = fVar16 * fVar22 + fVar32 * fVar21 + local_d8 * fVar20;
  (this->tv_plane).super_btVector3.m_floats[3] = fVar36;
  fVar24 = (fVar17 * fVar22 + fVar28 * fVar21 + fVar29 * fVar20) - fVar36;
  fVar25 = (fVar7 * fVar22 + fVar30 * fVar21 + fVar33 * fVar20) - fVar36;
  *(ulong *)this->du = CONCAT44(fVar25,fVar24);
  fVar26 = (fVar27 * fVar22 + fVar19 * fVar21 + fVar31 * fVar20) - fVar36;
  this->du[2] = fVar26;
  this->du0du1 = fVar25 * fVar24;
  this->du0du2 = fVar24 * fVar26;
  if ((0.0 < fVar25 * fVar24) && (0.0 < fVar24 * fVar26)) {
    if (0.0 <= fVar24) {
      if (fVar25 <= fVar26) {
        fVar26 = fVar25;
      }
      if (fVar24 <= fVar26) {
        fVar26 = fVar24;
      }
      (this->distances).m_floats[0] = fVar26;
      if (fVar26 <= fVar12) goto LAB_00177218;
    }
    else {
      if (fVar26 <= fVar25) {
        fVar26 = fVar25;
      }
      if (fVar26 <= fVar24) {
        fVar26 = fVar24;
      }
      fVar26 = -fVar26;
      (this->distances).m_floats[0] = fVar26;
      if (fVar26 <= fVar12) {
        local_d8 = local_d8 + fVar13;
        fVar24 = (fVar32 + fVar8) - fVar8;
        fVar13 = local_d8 - fVar13;
        *(ulong *)this->tv_vertices[1].m_floats = CONCAT44(fVar13,fVar24);
        local_d8 = local_d8 - fVar13;
        uVar23 = CONCAT44(local_d8,(fVar32 + fVar8) - fVar24);
        *(undefined8 *)this->tv_vertices[0].m_floats = uVar23;
        fVar16 = fVar16 + fVar18;
        fVar18 = fVar16 - fVar18;
        this->tv_vertices[1].m_floats[2] = fVar18;
        fVar16 = fVar16 - fVar18;
        this->tv_vertices[0].m_floats[2] = fVar16;
        (this->tv_plane).super_btVector3.m_floats[0] = -fVar21;
        (this->tv_plane).super_btVector3.m_floats[1] = -fVar20;
        (this->tv_plane).super_btVector3.m_floats[2] = -fVar22;
        (this->tv_plane).super_btVector3.m_floats[3] = -fVar36;
        uVar34 = CONCAT44(fVar13,fVar24);
        goto LAB_00177218;
      }
    }
    goto LAB_00177773;
  }
  if (0.0 <= (fVar24 + fVar25 + fVar26) / 3.0) {
    if (fVar25 <= fVar26) {
      fVar26 = fVar25;
    }
    if (fVar24 <= fVar26) {
      fVar26 = fVar24;
    }
    (this->distances).m_floats[0] = fVar26;
  }
  else {
    local_d8 = local_d8 + fVar13;
    fVar35 = (fVar32 + fVar8) - fVar8;
    fVar13 = local_d8 - fVar13;
    *(ulong *)this->tv_vertices[1].m_floats = CONCAT44(fVar13,fVar35);
    local_d8 = local_d8 - fVar13;
    uVar23 = CONCAT44(local_d8,(fVar32 + fVar8) - fVar35);
    *(undefined8 *)this->tv_vertices[0].m_floats = uVar23;
    fVar16 = fVar16 + fVar18;
    fVar18 = fVar16 - fVar18;
    this->tv_vertices[1].m_floats[2] = fVar18;
    fVar16 = fVar16 - fVar18;
    this->tv_vertices[0].m_floats[2] = fVar16;
    (this->tv_plane).super_btVector3.m_floats[0] = -fVar21;
    (this->tv_plane).super_btVector3.m_floats[1] = -fVar20;
    (this->tv_plane).super_btVector3.m_floats[2] = -fVar22;
    (this->tv_plane).super_btVector3.m_floats[3] = -fVar36;
    if (fVar26 <= fVar25) {
      fVar26 = fVar25;
    }
    if (fVar26 <= fVar24) {
      fVar26 = fVar24;
    }
    fVar26 = -fVar26;
    (this->distances).m_floats[0] = fVar26;
    uVar34 = CONCAT44(fVar13,fVar35);
  }
LAB_00177218:
  fVar27 = fVar27 - fVar17;
  fVar31 = fVar31 - fVar29;
  fVar19 = fVar19 - fVar28;
  fVar21 = (fVar33 - fVar29) * fVar27 - fVar31 * (fVar7 - fVar17);
  fVar22 = fVar19 * (fVar7 - fVar17) - fVar27 * (fVar30 - fVar28);
  *(ulong *)(this->tu_plane).super_btVector3.m_floats = CONCAT44(fVar22,fVar21);
  fVar32 = fVar31 * (fVar30 - fVar28) - (fVar33 - fVar29) * fVar19;
  (this->tu_plane).super_btVector3.m_floats[2] = fVar32;
  fVar20 = fVar32 * fVar32 + fVar21 * fVar21 + fVar22 * fVar22;
  if (1e-07 < fVar20) {
    fVar8 = (float)(0x5f3759df - ((uint)fVar20 >> 1));
    fVar8 = (fVar20 * -0.5 * fVar8 * fVar8 + 1.5) * fVar8;
    if (fVar8 < 3.4028235e+38) {
      fVar32 = fVar32 * fVar8;
      fVar21 = fVar21 * fVar8;
      fVar22 = fVar22 * fVar8;
      *(ulong *)(this->tu_plane).super_btVector3.m_floats = CONCAT44(fVar22,fVar21);
      (this->tu_plane).super_btVector3.m_floats[2] = fVar32;
    }
  }
  fVar20 = fVar17 * fVar32 + fVar28 * fVar21 + fVar29 * fVar22;
  (this->tu_plane).super_btVector3.m_floats[3] = fVar20;
  fVar16 = (fVar16 * fVar32 + (float)uVar23 * fVar21 + local_d8 * fVar22) - fVar20;
  this->dv[0] = fVar16;
  fVar13 = (fVar18 * fVar32 + (float)uVar34 * fVar21 + fVar13 * fVar22) - fVar20;
  fVar18 = (fVar1 * fVar32 + fVar14 * fVar21 + fVar15 * fVar22) - fVar20;
  *(ulong *)(this->dv + 1) = CONCAT44(fVar18,fVar13);
  this->dv0dv1 = fVar16 * fVar13;
  this->dv0dv2 = fVar16 * fVar18;
  if ((fVar16 * fVar13 <= 0.0) || (fVar16 * fVar18 <= 0.0)) {
    if (0.0 <= (fVar18 + fVar16 + fVar13) / 3.0) {
      if (fVar13 <= fVar18) {
        fVar18 = fVar13;
      }
      if (fVar16 <= fVar18) {
        fVar18 = fVar16;
      }
    }
    else {
      fVar14 = (fVar28 + fVar30) - fVar30;
      fVar15 = (fVar29 + fVar33) - fVar33;
      *(ulong *)this->tu_vertices[1].m_floats = CONCAT44(fVar15,fVar14);
      *(ulong *)this->tu_vertices[0].m_floats =
           CONCAT44((fVar29 + fVar33) - fVar15,(fVar28 + fVar30) - fVar14);
      fVar14 = (fVar17 + fVar7) - fVar7;
      this->tu_vertices[1].m_floats[2] = fVar14;
      this->tu_vertices[0].m_floats[2] = (fVar17 + fVar7) - fVar14;
      (this->tu_plane).super_btVector3.m_floats[0] = -fVar21;
      (this->tu_plane).super_btVector3.m_floats[1] = -fVar22;
      (this->tu_plane).super_btVector3.m_floats[2] = -fVar32;
      (this->tu_plane).super_btVector3.m_floats[3] = -fVar20;
      if (fVar18 <= fVar13) {
        fVar18 = fVar13;
      }
      if (fVar18 <= fVar16) {
        fVar18 = fVar16;
      }
      fVar18 = -fVar18;
    }
    (this->distances).m_floats[1] = fVar18;
  }
  else if (0.0 <= fVar16) {
    if (fVar13 <= fVar18) {
      fVar18 = fVar13;
    }
    if (fVar16 <= fVar18) {
      fVar18 = fVar16;
    }
    (this->distances).m_floats[1] = fVar18;
    if (fVar12 < fVar18) goto LAB_00177773;
  }
  else {
    if (fVar18 <= fVar13) {
      fVar18 = fVar13;
    }
    if (fVar18 <= fVar16) {
      fVar18 = fVar16;
    }
    fVar18 = -fVar18;
    (this->distances).m_floats[1] = fVar18;
    if (fVar12 < fVar18) {
LAB_00177773:
      uVar6 = 0;
      goto LAB_00177775;
    }
    fVar16 = (fVar28 + fVar30) - fVar30;
    fVar14 = (fVar29 + fVar33) - fVar33;
    *(ulong *)this->tu_vertices[1].m_floats = CONCAT44(fVar14,fVar16);
    *(ulong *)this->tu_vertices[0].m_floats =
         CONCAT44((fVar29 + fVar33) - fVar14,(fVar28 + fVar30) - fVar16);
    fVar16 = (fVar17 + fVar7) - fVar7;
    this->tu_vertices[1].m_floats[2] = fVar16;
    this->tu_vertices[0].m_floats[2] = (fVar17 + fVar7) - fVar16;
    (this->tu_plane).super_btVector3.m_floats[0] = -fVar21;
    (this->tu_plane).super_btVector3.m_floats[1] = -fVar22;
    (this->tu_plane).super_btVector3.m_floats[2] = -fVar32;
    (this->tu_plane).super_btVector3.m_floats[3] = -fVar20;
  }
  clip_points = this->contact_points;
  if (fVar26 < fVar18) {
    uVar4 = clip_triangle(this,&this->tu_plane,this->tu_vertices,this->tv_vertices,clip_points);
    uVar6 = 0;
    if (uVar4 == 0) goto LAB_00177775;
    fVar18 = this->margin;
    uVar34 = *(undefined8 *)((this->tu_plane).super_btVector3.m_floats + 2);
    *(undefined8 *)(contacts + 8) = *(undefined8 *)(this->tu_plane).super_btVector3.m_floats;
    *(undefined8 *)(contacts + 0x10) = uVar34;
    *(undefined8 *)contacts = 0xc47a0000;
    pbVar10 = this->contact_points[0].m_floats + 2;
    fVar16 = -1000.0;
    uVar11 = 0;
    do {
      fVar14 = fVar18 - (((this->tu_plane).super_btVector3.m_floats[2] * *pbVar10 +
                         (this->tu_plane).super_btVector3.m_floats[0] *
                         ((btVector3 *)(pbVar10 + -2))->m_floats[0] +
                         (this->tu_plane).super_btVector3.m_floats[1] * pbVar10[-1]) -
                        (this->tu_plane).super_btVector3.m_floats[3]);
      if (0.0 <= fVar14) {
        if (fVar14 <= fVar16) {
          if (fVar14 + 1.1920929e-07 < fVar16) goto LAB_001776ee;
          local_68[uVar6] = (uint)uVar11;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else {
          *(float *)contacts = fVar14;
          local_68[0] = (uint)uVar11;
          uVar6 = 1;
          fVar16 = fVar14;
        }
        *(int *)(contacts + 4) = (int)uVar6;
      }
LAB_001776ee:
      iVar5 = (int)uVar6;
      uVar11 = uVar11 + 1;
      pbVar10 = pbVar10 + 4;
    } while (uVar4 != uVar11);
    if (iVar5 != 0) {
      lVar9 = 0;
      do {
        uVar34 = *(undefined8 *)(clip_points[*(uint *)((long)local_68 + lVar9)].m_floats + 2);
        *(undefined8 *)(contacts + lVar9 * 4 + 0x18) =
             *(undefined8 *)clip_points[*(uint *)((long)local_68 + lVar9)].m_floats;
        *(undefined8 *)(contacts + lVar9 * 4 + 0x18 + 8) = uVar34;
        lVar9 = lVar9 + 4;
      } while (uVar6 << 2 != lVar9);
    }
    *(ulong *)(contacts + 8) = *(ulong *)(contacts + 8) ^ 0x8000000080000000;
    *(uint *)(contacts + 0x10) = *(uint *)(contacts + 0x10) ^ 0x80000000;
  }
  else {
    uVar4 = clip_triangle(this,&this->tv_plane,this->tv_vertices,this->tu_vertices,clip_points);
    uVar6 = 0;
    if (uVar4 == 0) goto LAB_00177775;
    fVar18 = this->margin;
    uVar34 = *(undefined8 *)((this->tv_plane).super_btVector3.m_floats + 2);
    *(undefined8 *)(contacts + 8) = *(undefined8 *)(this->tv_plane).super_btVector3.m_floats;
    *(undefined8 *)(contacts + 0x10) = uVar34;
    *(undefined8 *)contacts = 0xc47a0000;
    pbVar10 = this->contact_points[0].m_floats + 2;
    fVar16 = -1000.0;
    uVar11 = 0;
    do {
      fVar14 = fVar18 - (((this->tv_plane).super_btVector3.m_floats[2] * *pbVar10 +
                         (this->tv_plane).super_btVector3.m_floats[0] *
                         ((btVector3 *)(pbVar10 + -2))->m_floats[0] +
                         (this->tv_plane).super_btVector3.m_floats[1] * pbVar10[-1]) -
                        (this->tv_plane).super_btVector3.m_floats[3]);
      if (0.0 <= fVar14) {
        if (fVar14 <= fVar16) {
          if (fVar14 + 1.1920929e-07 < fVar16) goto LAB_001775e7;
          local_68[uVar6] = (uint)uVar11;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        else {
          *(float *)contacts = fVar14;
          local_68[0] = (uint)uVar11;
          uVar6 = 1;
          fVar16 = fVar14;
        }
        *(int *)(contacts + 4) = (int)uVar6;
      }
LAB_001775e7:
      iVar5 = (int)uVar6;
      uVar11 = uVar11 + 1;
      pbVar10 = pbVar10 + 4;
    } while (uVar4 != uVar11);
    if (iVar5 != 0) {
      lVar9 = 0;
      do {
        uVar34 = *(undefined8 *)(clip_points[*(uint *)((long)local_68 + lVar9)].m_floats + 2);
        *(undefined8 *)(contacts + lVar9 * 4 + 0x18) =
             *(undefined8 *)clip_points[*(uint *)((long)local_68 + lVar9)].m_floats;
        *(undefined8 *)(contacts + lVar9 * 4 + 0x18 + 8) = uVar34;
        lVar9 = lVar9 + 4;
      } while (uVar6 << 2 != lVar9);
    }
  }
  uVar6 = (ulong)(iVar5 != 0);
LAB_00177775:
  return SUB81(uVar6,0);
}

Assistant:

SIMD_FORCE_INLINE bool triangle_collision(
					const btVector3 & u0,
					const btVector3 & u1,
					const btVector3 & u2,
					GREAL margin_u,
					const btVector3 & v0,
					const btVector3 & v1,
					const btVector3 & v2,
					GREAL margin_v,
					GIM_TRIANGLE_CONTACT_DATA & contacts)
	{

		margin = margin_u + margin_v;

		tu_vertices[0] = u0;
		tu_vertices[1] = u1;
		tu_vertices[2] = u2;

		tv_vertices[0] = v0;
		tv_vertices[1] = v1;
		tv_vertices[2] = v2;

		//create planes
		// plane v vs U points

		TRIANGLE_PLANE(tv_vertices[0],tv_vertices[1],tv_vertices[2],tv_plane);

		du[0] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[0]);
		du[1] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[1]);
		du[2] = DISTANCE_PLANE_POINT(tv_plane,tu_vertices[2]);


		du0du1 = du[0] * du[1];
		du0du2 = du[0] * du[2];


		if(du0du1>0.0f && du0du2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(du[0]<0) //we need test behind the triangle plane
			{
				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
				if(distances[0]>margin) return false; //never intersect

				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
				if(distances[0]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[0] = (du[0]+du[1]+du[2])/3.0f; //centroid

			if(distances[0]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tv_vertices[0],tv_vertices[1]);
				VEC_SCALE_4(tv_plane,-1.0f,tv_plane);

				distances[0] = GIM_MAX3(du[0],du[1],du[2]);
				distances[0] = -distances[0];
			}
			else
			{
				distances[0] = GIM_MIN3(du[0],du[1],du[2]);
			}
		}


		// plane U vs V points

		TRIANGLE_PLANE(tu_vertices[0],tu_vertices[1],tu_vertices[2],tu_plane);

		dv[0] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[0]);
		dv[1] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[1]);
		dv[2] = DISTANCE_PLANE_POINT(tu_plane,tv_vertices[2]);

		dv0dv1 = dv[0] * dv[1];
		dv0dv2 = dv[0] * dv[2];


		if(dv0dv1>0.0f && dv0dv2>0.0f)	// same sign on all of them + not equal 0 ?
		{
			if(dv[0]<0) //we need test behind the triangle plane
			{
				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
				if(distances[1]>margin) return false; //never intersect

				//reorder triangle u
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
				if(distances[1]>margin) return false; //never intersect
			}
		}
		else
		{
			//Look if we need to invert the triangle
			distances[1] = (dv[0]+dv[1]+dv[2])/3.0f; //centroid

			if(distances[1]<0.0f)
			{
				//reorder triangle v
				VEC_SWAP(tu_vertices[0],tu_vertices[1]);
				VEC_SCALE_4(tu_plane,-1.0f,tu_plane);

				distances[1] = GIM_MAX3(dv[0],dv[1],dv[2]);
				distances[1] = -distances[1];
			}
			else
			{
				distances[1] = GIM_MIN3(dv[0],dv[1],dv[2]);
			}
		}

		GUINT bl;
		/* bl = cross_line_intersection_test();
		if(bl==3)
		{
			//take edge direction too
			bl = distances.maxAxis();
		}
		else
		{*/
			bl = 0;
			if(distances[0]<distances[1]) bl = 1;
		//}

		if(bl==2) //edge edge separation
		{
			if(distances[2]>margin) return false;

			contacts.m_penetration_depth = -distances[2] + margin;
			contacts.m_points[0] = closest_point_v;
			contacts.m_point_count = 1;
			VEC_COPY(contacts.m_separating_normal,edge_edge_dir);

			return true;
		}

		//clip face against other

		
		GUINT point_count;
		//TODO
		if(bl == 0) //clip U points against V
		{
			point_count = clip_triangle(tv_plane,tv_vertices,tu_vertices,contact_points);
			if(point_count == 0) return false;						
			contacts.merge_points(tv_plane,margin,contact_points,point_count);			
		}
		else //clip V points against U
		{
			point_count = clip_triangle(tu_plane,tu_vertices,tv_vertices,contact_points);
			if(point_count == 0) return false;			
			contacts.merge_points(tu_plane,margin,contact_points,point_count);
			contacts.m_separating_normal *= -1.f;
		}
		if(contacts.m_point_count == 0) return false;
		return true;
	}